

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderReturnTests::init(ShaderReturnTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  ShaderReturnCase *pSVar2;
  ulong uVar3;
  char *pcVar4;
  ReturnMode RVar5;
  TestNode *pTVar6;
  ulong uVar7;
  int iVar8;
  bool isDynamicLoop;
  allocator<char> local_101;
  TestNode *local_100;
  char *local_f8;
  ulong local_f0;
  string description;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  char *local_80;
  char *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"single_return_vertex",
             "Single return statement in function",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"single_return_fragment",
             "Single return statement in function",false,
             "varying mediump vec4 v_coords;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_FragColor = getColor();\n}\n"
             ,evalReturnAlways,0);
  local_100 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  for (RVar5 = RETURNMODE_ALWAYS; RVar5 != RETURNMODE_LAST; RVar5 = RVar5 + RETURNMODE_NEVER) {
    iVar1 = 2;
    while( true ) {
      if (iVar1 == 0) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"conditional_return_",(allocator<char> *)&local_70);
      if (RVar5 < RETURNMODE_LAST) {
        pcVar4 = *(char **)(&DAT_0071a150 + (ulong)RVar5 * 8);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      std::operator+(&description,&local_a0,pcVar4);
      pcVar4 = "_fragment";
      if (iVar1 == 2) {
        pcVar4 = "_vertex";
      }
      std::operator+(&name,&description,pcVar4);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&local_a0);
      if (RVar5 < RETURNMODE_LAST) {
        pcVar4 = (&PTR_anon_var_dwarf_1cfed3_0071a168)[RVar5];
      }
      else {
        pcVar4 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,pcVar4,(allocator<char> *)&local_70);
      std::operator+(&description,&local_a0," in function");
      std::__cxx11::string::~string((string *)&local_a0);
      pTVar6 = local_100;
      pSVar2 = makeConditionalReturnInFuncCase
                         ((Context *)local_100[1]._vptr_TestNode,name._M_dataplus._M_p,
                          description._M_dataplus._M_p,RVar5,iVar1 == 2);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar2);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&name);
      iVar1 = iVar1 + -1;
    }
  }
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  pTVar6 = local_100;
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(Context *)local_100[1]._vptr_TestNode,"double_return_vertex",
             "Unconditional double return in function",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n    return vec4(a_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(Context *)pTVar6[1]._vptr_TestNode,"double_return_fragment",
             "Unconditional double return in function",false,
             "varying mediump vec4 v_coords;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n    return vec4(v_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_FragColor = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(Context *)pTVar6[1]._vptr_TestNode,"last_statement_in_main_vertex",
             "Return as a final statement in main()",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(Context *)pTVar6[1]._vptr_TestNode,"last_statement_in_main_fragment",
             "Return as a final statement in main()",false,
             "varying mediump vec4 v_coords;\n\nvoid main (void)\n{\n    gl_FragColor = vec4(v_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar2);
  for (iVar1 = 0; iVar1 != 2; iVar1 = iVar1 + 1) {
    local_78 = "";
    if (iVar1 != 0) {
      local_78 = "in_func_";
    }
    local_80 = " in main()";
    if (iVar1 != 0) {
      local_80 = " in user-defined function";
    }
    for (RVar5 = RETURNMODE_ALWAYS; RVar5 != RETURNMODE_LAST; RVar5 = RVar5 + RETURNMODE_NEVER) {
      local_f8 = (char *)(ulong)RVar5;
      iVar8 = 2;
      while (local_f0 = CONCAT44(local_f0._4_4_,iVar8 + -1), iVar8 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"output_write_",(allocator<char> *)&local_50);
        std::operator+(&local_a0,&local_70,local_78);
        if (RVar5 < RETURNMODE_LAST) {
          pcVar4 = *(char **)(&DAT_0071a150 + (long)local_f8 * 8);
        }
        else {
          pcVar4 = (char *)0x0;
        }
        std::operator+(&description,&local_a0,pcVar4);
        pcVar4 = "_fragment";
        if (iVar8 == 2) {
          pcVar4 = "_vertex";
        }
        std::operator+(&name,&description,pcVar4);
        std::__cxx11::string::~string((string *)&description);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_70);
        if (RVar5 < RETURNMODE_LAST) {
          pcVar4 = (&PTR_anon_var_dwarf_1cfed3_0071a168)[(long)local_f8];
        }
        else {
          pcVar4 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,pcVar4,(allocator<char> *)&local_50);
        std::operator+(&local_a0,&local_70,local_80);
        std::operator+(&description,&local_a0," between output writes");
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_70);
        pTVar6 = local_100;
        pSVar2 = makeOutputWriteReturnCase
                           ((Context *)local_100[1]._vptr_TestNode,name._M_dataplus._M_p,
                            description._M_dataplus._M_p,iVar1 != 0,RVar5,iVar8 == 2);
        tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar2);
        std::__cxx11::string::~string((string *)&description);
        std::__cxx11::string::~string((string *)&name);
        iVar8 = (int)local_f0;
      }
    }
  }
  uVar3 = 0;
  while ((int)uVar3 != 2) {
    local_f8 = "static";
    if ((int)uVar3 != 0) {
      local_f8 = "dynamic";
    }
    uVar7 = 0;
    local_f0 = uVar3;
    while (RVar5 = (ReturnMode)uVar7, RVar5 != RETURNMODE_LAST) {
      iVar1 = 2;
      while( true ) {
        if (iVar1 == 0) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"return_in_",&local_101);
        std::operator+(&local_70,&local_50,local_f8);
        std::operator+(&local_a0,&local_70,"_loop_");
        if (RVar5 < RETURNMODE_LAST) {
          pcVar4 = *(char **)(&DAT_0071a150 + uVar7 * 8);
        }
        else {
          pcVar4 = (char *)0x0;
        }
        std::operator+(&description,&local_a0,pcVar4);
        pcVar4 = "_fragment";
        if (iVar1 == 2) {
          pcVar4 = "_vertex";
        }
        std::operator+(&name,&description,pcVar4);
        std::__cxx11::string::~string((string *)&description);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        if (RVar5 < RETURNMODE_LAST) {
          pcVar4 = (&PTR_anon_var_dwarf_1cfed3_0071a168)[uVar7];
        }
        else {
          pcVar4 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,pcVar4,(allocator<char> *)&local_70);
        std::operator+(&description,&local_a0," in loop");
        isDynamicLoop = (int)local_f0 != 0;
        std::__cxx11::string::~string((string *)&local_a0);
        pTVar6 = local_100;
        pSVar2 = makeReturnInLoopCase
                           ((Context *)local_100[1]._vptr_TestNode,name._M_dataplus._M_p,
                            description._M_dataplus._M_p,isDynamicLoop,RVar5,iVar1 == 2);
        tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar2);
        std::__cxx11::string::~string((string *)&description);
        std::__cxx11::string::~string((string *)&name);
        iVar1 = iVar1 + -1;
      }
      uVar7 = (ulong)(RVar5 + RETURNMODE_NEVER);
    }
    uVar3 = (ulong)((int)local_f0 + 1);
  }
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(Context *)pTVar6[1]._vptr_TestNode,"return_in_infinite_loop_vertex",
             "Return in infinite loop",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\nuniform int ui_zero;\n\nhighp vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn a_coords;\n\treturn a_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(Context *)pTVar6[1]._vptr_TestNode,"return_in_infinite_loop_fragment",
             "Return in infinite loop",false,
             "varying mediump vec4 v_coords;\nuniform int ui_zero;\n\nmediump vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn v_coords;\n\treturn v_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_FragColor = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,1);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar2);
  return extraout_EAX;
}

Assistant:

void ShaderReturnTests::init (void)
{
	// Single return statement in function.
	addChild(new ShaderReturnCase(m_context, "single_return_vertex", "Single return statement in function", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "single_return_fragment", "Single return statement in function", false,
		"varying mediump vec4 v_coords;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = getColor();\n"
		"}\n", evalReturnAlways));

	// Conditional return statement in function.
	for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
	{
		for (int isFragment = 0; isFragment < 2; isFragment++)
		{
			string name			= string("conditional_return_") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
			string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in function";
			addChild(makeConditionalReturnInFuncCase(m_context, name.c_str(), description.c_str(), (ReturnMode)returnMode, isFragment == 0));
		}
	}

	// Unconditional double return in function.
	addChild(new ShaderReturnCase(m_context, "double_return_vertex", "Unconditional double return in function", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"    return vec4(a_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "double_return_fragment", "Unconditional double return in function", false,
		"varying mediump vec4 v_coords;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"    return vec4(v_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = getColor();\n"
		"}\n", evalReturnAlways));

	// Last statement in main.
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_vertex", "Return as a final statement in main()", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_fragment", "Return as a final statement in main()", false,
		"varying mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = vec4(v_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));

	// Return between output variable writes.
	for (int inFunc = 0; inFunc < 2; inFunc++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name = string("output_write_") + (inFunc ? "in_func_" : "") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string desc = string(getReturnModeDesc((ReturnMode)returnMode)) + (inFunc ? " in user-defined function" : " in main()") + " between output writes";

				addChild(makeOutputWriteReturnCase(m_context, name.c_str(), desc.c_str(), inFunc != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Conditional return statement in loop.
	for (int isDynamicLoop = 0; isDynamicLoop < 2; isDynamicLoop++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name			= string("return_in_") + (isDynamicLoop ? "dynamic" : "static") + "_loop_" + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in loop";
				addChild(makeReturnInLoopCase(m_context, name.c_str(), description.c_str(), isDynamicLoop != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Unconditional return in infinite loop.
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_vertex", "Return in infinite loop", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n"
		"uniform int ui_zero;\n\n"
		"highp vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return a_coords;\n"
		"	return a_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, REQUIRE_DYNAMIC_LOOPS));
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_fragment", "Return in infinite loop", false,
		"varying mediump vec4 v_coords;\n"
		"uniform int ui_zero;\n\n"
		"mediump vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return v_coords;\n"
		"	return v_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, REQUIRE_DYNAMIC_LOOPS));
}